

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

aiMaterial * __thiscall Assimp::D3MF::XmlSerializer::readMaterialDef(XmlSerializer *this)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__s;
  size_t sVar3;
  aiMaterial *this_00;
  string stdMatName;
  string strId;
  string nodeName;
  aiString matName;
  undefined1 *local_600;
  ulong local_5f8;
  undefined1 local_5f0;
  undefined7 uStack_5ef;
  long *local_5e0;
  long local_5d0 [2];
  long *local_5c0;
  size_t local_5b8;
  long local_5b0 [2];
  long *local_5a0 [2];
  long local_590 [12];
  ios_base local_530 [268];
  aiString local_424;
  undefined4 extraout_var_00;
  
  iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,(char *)CONCAT44(extraout_var,iVar2),(allocator<char> *)&local_424
            );
  if (local_5b8 == _DAT_00901540) {
    if (local_5b8 != 0) {
      iVar2 = bcmp(local_5c0,XmlTag::basematerials_base_abi_cxx11_,local_5b8);
      if (iVar2 != 0) goto LAB_00617799;
    }
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[7])
                      (this->xmlReader,XmlTag::basematerials_name_abi_cxx11_);
    __s = (char *)CONCAT44(extraout_var_00,iVar2);
    local_5f8 = 0;
    local_5f0 = 0;
    local_424.length = 0;
    local_424.data[0] = '\0';
    local_600 = &local_5f0;
    memset(local_424.data + 1,0x1b,0x3ff);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
    std::ostream::_M_insert<unsigned_long>((ulong)local_5a0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
    std::ios_base::~ios_base(local_530);
    std::__cxx11::string::append((char *)&local_600);
    std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_5e0);
    std::__cxx11::string::append((char *)&local_600);
    if (__s == (char *)0x0) {
      std::__cxx11::string::append((char *)&local_600);
    }
    else {
      local_5a0[0] = local_590;
      sVar3 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,__s,__s + sVar3);
      std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_5a0[0]);
      if (local_5a0[0] != local_590) {
        operator_delete(local_5a0[0],local_590[0] + 1);
      }
    }
    uVar1 = local_5f8;
    if (local_5f8 < 0x400) {
      local_424.length = (ai_uint32)local_5f8;
      memcpy(local_424.data,local_600,local_5f8);
      local_424.data[uVar1] = '\0';
    }
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    aiMaterial::AddProperty(this_00,&local_424,"?mat.name",0,0);
    assignDiffuseColor(this,this_00);
    if (local_5e0 != local_5d0) {
      operator_delete(local_5e0,local_5d0[0] + 1);
    }
    if (local_600 != &local_5f0) {
      operator_delete(local_600,CONCAT71(uStack_5ef,local_5f0) + 1);
    }
  }
  else {
LAB_00617799:
    this_00 = (aiMaterial *)0x0;
  }
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0,local_5b0[0] + 1);
  }
  return this_00;
}

Assistant:

aiMaterial *readMaterialDef() {
        aiMaterial *mat( nullptr );
        const char *name( nullptr );
        const std::string nodeName( xmlReader->getNodeName() );
        if ( nodeName == D3MF::XmlTag::basematerials_base ) {
            name = xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_name.c_str() );
            std::string stdMatName;
            aiString matName;
            std::string strId( to_string( mActiveMatGroup ) );
            stdMatName += "id";
            stdMatName += strId;
            stdMatName += "_";
            if ( nullptr != name ) {
                stdMatName += std::string( name );
            } else {
                stdMatName += "basemat";
            }
            matName.Set( stdMatName );

            mat = new aiMaterial;
            mat->AddProperty( &matName, AI_MATKEY_NAME );

            assignDiffuseColor( mat );
        }

        return mat;
    }